

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNArg::gen_code(CTPNArg *this,int param_1,int param_2)

{
  int iVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcGenTarg *pCVar4;
  
  pCVar3 = (this->super_CTPNArgBase).arg_expr_;
  (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
  if (((this->super_CTPNArgBase).field_0x40 & 1) != 0) {
    CTcGenTarg::write_op(G_cg,'\x0e');
    pCVar4 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar4->max_sp_depth_ <= iVar2) {
      pCVar4->max_sp_depth_ = iVar1;
    }
    pCVar4->sp_depth_ = pCVar4->sp_depth_ + -1;
  }
  return;
}

Assistant:

void CTPNArg::gen_code(int, int)
{
    /* 
     *   Generate the argument expression.  We need the value (hence
     *   discard = false), and we need the assignable value (hence
     *   for_condition = false). 
     */
    get_arg_expr()->gen_code(FALSE, FALSE);

    /* 
     *   if this is a list-to-varargs conversion, generate the conversion
     *   instruction 
     */
    if (is_varargs_)
    {
        /* write the opcode */
        G_cg->write_op(OPC_MAKELSTPAR);

        /* note the extra push and pop for the argument count */
        G_cg->note_push();
        G_cg->note_pop();
    }
}